

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.h
# Opt level: O1

bool __thiscall spvtools::opt::analysis::CompositeConstant::IsZero(CompositeConstant *this)

{
  undefined8 *puVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  bool bVar5;
  
  iVar3 = (*(this->super_Constant)._vptr_Constant[0x18])();
  puVar4 = *(undefined8 **)CONCAT44(extraout_var,iVar3);
  puVar1 = (undefined8 *)((long *)CONCAT44(extraout_var,iVar3))[1];
  bVar5 = puVar4 == puVar1;
  if (!bVar5) {
    cVar2 = (**(code **)(*(long *)*puVar4 + 0xb8))();
    while (cVar2 != '\0') {
      puVar4 = puVar4 + 1;
      bVar5 = puVar4 == puVar1;
      if (bVar5) {
        return bVar5;
      }
      cVar2 = (**(code **)(*(long *)*puVar4 + 0xb8))();
    }
  }
  return bVar5;
}

Assistant:

bool IsZero() const override {
    for (const Constant* c : GetComponents()) {
      if (!c->IsZero()) {
        return false;
      }
    }
    return true;
  }